

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

With * sqlite3WithAdd(Parse *pParse,With *pWith,Cte *pCte)

{
  CteUse **ppCVar1;
  Select **ppSVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  sqlite3 *db;
  char *pcVar6;
  ExprList *pEVar7;
  Select *pSVar8;
  char *pcVar9;
  undefined8 uVar10;
  With *pWVar11;
  long lVar12;
  long lVar13;
  
  pWVar11 = pWith;
  if (pCte != (Cte *)0x0) {
    db = pParse->db;
    pcVar6 = pCte->zName;
    if ((pWith != (With *)0x0 && pcVar6 != (char *)0x0) && (0 < pWith->nCte)) {
      lVar13 = 0;
LAB_00177912:
      lVar12 = 0;
      do {
        bVar3 = pcVar6[lVar12];
        bVar4 = pWith->a[lVar13].zName[lVar12];
        if (bVar3 == bVar4) {
          if ((ulong)bVar3 == 0) goto LAB_00177945;
        }
        else if (""[bVar3] != ""[bVar4]) goto LAB_00177945;
        lVar12 = lVar12 + 1;
      } while( true );
    }
LAB_00177969:
    if (pWith == (With *)0x0) {
      pWVar11 = (With *)sqlite3DbMallocZero(db,0x40);
    }
    else {
      pWVar11 = (With *)sqlite3DbRealloc(db,pWith,(long)pWith->nCte * 0x30 + 0x40);
    }
    if (db->mallocFailed == '\0') {
      iVar5 = pWVar11->nCte;
      pWVar11->nCte = iVar5 + 1;
      pcVar6 = pCte->zName;
      pEVar7 = pCte->pCols;
      pSVar8 = pCte->pSelect;
      pcVar9 = pCte->zCteErr;
      uVar10 = *(undefined8 *)&pCte->eM10d;
      ppCVar1 = &pWVar11->a[iVar5].pUse;
      *ppCVar1 = pCte->pUse;
      ppCVar1[1] = (CteUse *)uVar10;
      ppSVar2 = &pWVar11->a[iVar5].pSelect;
      *ppSVar2 = pSVar8;
      ppSVar2[1] = (Select *)pcVar9;
      pWVar11->a[iVar5].zName = pcVar6;
      pWVar11->a[iVar5].pCols = pEVar7;
    }
    else {
      cteClear(db,pCte);
      pWVar11 = pWith;
    }
    sqlite3DbFreeNN(db,pCte);
  }
  return pWVar11;
LAB_00177945:
  if (bVar3 == bVar4) {
    sqlite3ErrorMsg(pParse,"duplicate WITH table name: %s",pcVar6);
  }
  lVar13 = lVar13 + 1;
  if (pWith->nCte <= lVar13) goto LAB_00177969;
  goto LAB_00177912;
}

Assistant:

SQLITE_PRIVATE With *sqlite3WithAdd(
  Parse *pParse,          /* Parsing context */
  With *pWith,            /* Existing WITH clause, or NULL */
  Cte *pCte               /* CTE to add to the WITH clause */
){
  sqlite3 *db = pParse->db;
  With *pNew;
  char *zName;

  if( pCte==0 ){
    return pWith;
  }

  /* Check that the CTE name is unique within this WITH clause. If
  ** not, store an error in the Parse structure. */
  zName = pCte->zName;
  if( zName && pWith ){
    int i;
    for(i=0; i<pWith->nCte; i++){
      if( sqlite3StrICmp(zName, pWith->a[i].zName)==0 ){
        sqlite3ErrorMsg(pParse, "duplicate WITH table name: %s", zName);
      }
    }
  }

  if( pWith ){
    sqlite3_int64 nByte = sizeof(*pWith) + (sizeof(pWith->a[1]) * pWith->nCte);
    pNew = sqlite3DbRealloc(db, pWith, nByte);
  }else{
    pNew = sqlite3DbMallocZero(db, sizeof(*pWith));
  }
  assert( (pNew!=0 && zName!=0) || db->mallocFailed );

  if( db->mallocFailed ){
    sqlite3CteDelete(db, pCte);
    pNew = pWith;
  }else{
    pNew->a[pNew->nCte++] = *pCte;
    sqlite3DbFree(db, pCte);
  }

  return pNew;
}